

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorTests.cpp
# Opt level: O0

TestStatus *
vkt::FragmentOperations::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef *caseDef)

{
  float *this;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  RefData<vk::Handle<(vk::HandleType)8>_> data_01;
  RefData<vk::Handle<(vk::HandleType)8>_> data_02;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  MovePtr *vk_00;
  VkDevice device_00;
  Allocator *allocator_00;
  VkDeviceSize bufferSize;
  Handle<(vk::HandleType)8> *pHVar5;
  Allocation *pAVar6;
  VkDeviceMemory memory;
  void *pvVar7;
  TestContext *this_00;
  TestLog *log;
  MovePtr *pMVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  allocator<char> local_539;
  string local_538;
  undefined4 local_518;
  allocator<char> local_511;
  string local_510;
  Vector<float,_4> local_4f0;
  PixelBufferAccess local_4e0;
  TextureFormat local_4b8;
  undefined1 local_4b0 [8];
  PixelBufferAccess referenceImage;
  undefined1 local_480 [8];
  ConstPixelBufferAccess resultImage;
  CaseDef local_434;
  undefined1 local_410 [8];
  ScissorRenderer renderer;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_238;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_228;
  undefined1 local_218 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorBufferScissoredAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> local_1d0;
  RefData<vk::Handle<(vk::HandleType)8>_> local_1b0;
  undefined1 local_190 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> colorBufferScissored;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_160;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_150;
  undefined1 local_140 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> colorBufferFullAlloc;
  VkBufferCreateInfo local_120;
  Move<vk::Handle<(vk::HandleType)8>_> local_e8;
  RefData<vk::Handle<(vk::HandleType)8>_> local_c8;
  undefined1 local_a8 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> colorBufferFull;
  VkDeviceSize colorBufferSize;
  Vec4 clearColor;
  Vec4 primitiveColor;
  Vec4 scissorFullArea;
  VkFormat colorFormat;
  IVec2 renderSize;
  Allocator *allocator;
  VkDevice device;
  DeviceInterface *vk;
  CaseDef *caseDef_local;
  Context *context_local;
  
  vk_00 = (MovePtr *)Context::getDeviceInterface(context);
  device_00 = Context::getDevice(context);
  allocator_00 = Context::getDefaultAllocator(context);
  this = scissorFullArea.m_data + 3;
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,0x80,0x80);
  scissorFullArea.m_data[2] = 5.1848e-44;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(primitiveColor.m_data + 2),0.0,0.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(clearColor.m_data + 2),1.0,1.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)&colorBufferSize + 4),0.5,0.5,1.0,1.0);
  iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)this);
  iVar3 = tcu::Vector<int,_2>::y((Vector<int,_2> *)this);
  colorBufferFull.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar4 = tcu::getPixelSize((TextureFormat)
                            colorBufferFull.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                            deleter.m_allocator);
  bufferSize = (VkDeviceSize)(iVar2 * iVar3 * iVar4);
  makeBufferCreateInfo(&local_120,bufferSize,2);
  makeBuffer(&local_e8,(DeviceInterface *)vk_00,device_00,&local_120);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_c8,(Move *)&local_e8);
  uVar9 = (undefined4)local_c8.object.m_internal;
  uVar10 = (undefined4)(local_c8.object.m_internal >> 0x20);
  data_01.deleter.m_deviceIface = local_c8.deleter.m_deviceIface;
  data_01.object.m_internal = local_c8.object.m_internal;
  data_01.deleter.m_device = local_c8.deleter.m_device;
  data_01.deleter.m_allocator = local_c8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_a8,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_e8);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_a8);
  colorBufferScissored.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  pMVar8 = vk_00;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_160,
             (DeviceInterface *)vk_00,device_00,allocator_00,(VkBuffer)pHVar5->m_internal,
             ::vk::MemoryRequirement::HostVisible);
  local_150 = de::details::MovePtr::operator_cast_to_PtrData(&local_160,pMVar8);
  data.ptr._4_4_ = uVar10;
  data.ptr._0_4_ = uVar9;
  data._8_8_ = local_c8.deleter.m_deviceIface;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_140,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_160);
  makeBufferCreateInfo
            ((VkBufferCreateInfo *)
             &colorBufferScissoredAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
             ,bufferSize,2);
  makeBuffer(&local_1d0,(DeviceInterface *)vk_00,device_00,
             (VkBufferCreateInfo *)
             &colorBufferScissoredAlloc.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1b0,(Move *)&local_1d0);
  uVar9 = (undefined4)local_1b0.object.m_internal;
  uVar10 = (undefined4)(local_1b0.object.m_internal >> 0x20);
  data_02.deleter.m_deviceIface = local_1b0.deleter.m_deviceIface;
  data_02.object.m_internal = local_1b0.object.m_internal;
  data_02.deleter.m_device = local_1b0.deleter.m_device;
  data_02.deleter.m_allocator = local_1b0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_190,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_1d0);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_190);
  renderer.m_cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal._4_4_
       = ::vk::MemoryRequirement::HostVisible.m_flags;
  pMVar8 = vk_00;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_238,
             (DeviceInterface *)vk_00,device_00,allocator_00,(VkBuffer)pHVar5->m_internal,
             ::vk::MemoryRequirement::HostVisible);
  local_228 = de::details::MovePtr::operator_cast_to_PtrData(&local_238,pMVar8);
  data_00.ptr._4_4_ = uVar10;
  data_00.ptr._0_4_ = uVar9;
  data_00._8_8_ = local_1b0.deleter.m_deviceIface;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_218,data_00);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_238);
  pAVar6 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator*
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_140);
  zeroBuffer((DeviceInterface *)vk_00,device_00,pAVar6,bufferSize);
  pAVar6 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator*
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_218);
  zeroBuffer((DeviceInterface *)vk_00,device_00,pAVar6,bufferSize);
  CaseDef::CaseDef(&local_434,caseDef);
  ScissorRenderer::ScissorRenderer
            ((ScissorRenderer *)local_410,context,&local_434,(IVec2 *)(scissorFullArea.m_data + 3),
             VK_FORMAT_R8G8B8A8_UNORM,(Vec4 *)(clearColor.m_data + 2),
             (Vec4 *)((long)&colorBufferSize + 4));
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_a8);
  ScissorRenderer::draw
            ((ScissorRenderer *)local_410,context,(Vec4 *)(primitiveColor.m_data + 2),
             (VkBuffer)pHVar5->m_internal);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_190);
  ScissorRenderer::draw
            ((ScissorRenderer *)local_410,context,&caseDef->scissorArea,(VkBuffer)pHVar5->m_internal
            );
  ScissorRenderer::~ScissorRenderer((ScissorRenderer *)local_410);
  pAVar6 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_140);
  memory = ::vk::Allocation::getMemory(pAVar6);
  ::vk::invalidateMappedMemoryRange((DeviceInterface *)vk_00,device_00,memory,0,bufferSize);
  pAVar6 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_218);
  resultImage.m_data = (void *)::vk::Allocation::getMemory(pAVar6);
  ::vk::invalidateMappedMemoryRange
            ((DeviceInterface *)vk_00,device_00,(VkDeviceMemory)resultImage.m_data,0,bufferSize);
  referenceImage.super_ConstPixelBufferAccess.m_data =
       (void *)::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)(scissorFullArea.m_data + 3));
  iVar3 = tcu::Vector<int,_2>::y((Vector<int,_2> *)(scissorFullArea.m_data + 3));
  pAVar6 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_218);
  pvVar7 = ::vk::Allocation::getHostPtr(pAVar6);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_480,
             (TextureFormat *)&referenceImage.super_ConstPixelBufferAccess.m_data,iVar2,iVar3,1,
             pvVar7);
  local_4b8 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)(scissorFullArea.m_data + 3));
  iVar3 = tcu::Vector<int,_2>::y((Vector<int,_2> *)(scissorFullArea.m_data + 3));
  pAVar6 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_140);
  pvVar7 = ::vk::Allocation::getHostPtr(pAVar6);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_4b0,&local_4b8,iVar2,iVar3,1,pvVar7);
  tcu::PixelBufferAccess::PixelBufferAccess(&local_4e0,(PixelBufferAccess *)local_4b0);
  applyScissor(&local_4e0,&caseDef->scissorArea,(Vec4 *)((long)&colorBufferSize + 4));
  this_00 = Context::getTestContext(context);
  log = tcu::TestContext::getLog(this_00);
  tcu::Vector<float,_4>::Vector(&local_4f0,0.02);
  bVar1 = tcu::floatThresholdCompare
                    (log,"color","Image compare",(ConstPixelBufferAccess *)local_4b0,
                     (ConstPixelBufferAccess *)local_480,&local_4f0,COMPARE_LOG_RESULT);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"OK",&local_539);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_538);
    std::__cxx11::string::~string((string *)&local_538);
    std::allocator<char>::~allocator(&local_539);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_510,"Rendered image is not correct",&local_511);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_510);
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator(&local_511);
  }
  local_518 = 1;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_218);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_190);
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_140);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const DeviceInterface&			vk							= context.getDeviceInterface();
	const VkDevice					device						= context.getDevice();
	Allocator&						allocator					= context.getDefaultAllocator();

	const IVec2						renderSize					(128, 128);
	const VkFormat					colorFormat					= VK_FORMAT_R8G8B8A8_UNORM;
	const Vec4						scissorFullArea				(0.0f, 0.0f, 1.0f, 1.0f);
	const Vec4						primitiveColor				(1.0f, 1.0f, 1.0f, 1.0f);
	const Vec4						clearColor					(0.5f, 0.5f, 1.0f, 1.0f);

	const VkDeviceSize				colorBufferSize				= renderSize.x() * renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Unique<VkBuffer>			colorBufferFull				(makeBuffer(vk, device, makeBufferCreateInfo(colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT)));
	const UniquePtr<Allocation>		colorBufferFullAlloc		(bindBuffer(vk, device, allocator, *colorBufferFull, MemoryRequirement::HostVisible));

	const Unique<VkBuffer>			colorBufferScissored		(makeBuffer(vk, device, makeBufferCreateInfo(colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT)));
	const UniquePtr<Allocation>		colorBufferScissoredAlloc	(bindBuffer(vk, device, allocator, *colorBufferScissored, MemoryRequirement::HostVisible));

	zeroBuffer(vk, device, *colorBufferFullAlloc, colorBufferSize);
	zeroBuffer(vk, device, *colorBufferScissoredAlloc, colorBufferSize);

	// Draw
	{
		const ScissorRenderer renderer (context, caseDef, renderSize, colorFormat, primitiveColor, clearColor);

		renderer.draw(context, scissorFullArea, *colorBufferFull);
		renderer.draw(context, caseDef.scissorArea, *colorBufferScissored);
	}

	// Log image
	{
		invalidateMappedMemoryRange(vk, device, colorBufferFullAlloc->getMemory(), 0ull, colorBufferSize);
		invalidateMappedMemoryRange(vk, device, colorBufferScissoredAlloc->getMemory(), 0ull, colorBufferSize);

		const tcu::ConstPixelBufferAccess	resultImage		(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1u, colorBufferScissoredAlloc->getHostPtr());
		tcu::PixelBufferAccess				referenceImage	(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1u, colorBufferFullAlloc->getHostPtr());

		// Apply scissor to the full image, so we can compare it with the result image.
		applyScissor (referenceImage, caseDef.scissorArea, clearColor);

		// Images should now match.
		if (!tcu::floatThresholdCompare(context.getTestContext().getLog(), "color", "Image compare", referenceImage, resultImage, Vec4(0.02f), tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Rendered image is not correct");
	}

	return tcu::TestStatus::pass("OK");
}